

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpDiscovery.c
# Opt level: O2

int UpnpDiscovery_assign(UpnpDiscovery *p,UpnpDiscovery *q)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  int iVar7;
  long lVar8;
  sockaddr_storage *psVar9;
  sockaddr_storage *psVar10;
  byte bVar11;
  
  bVar11 = 0;
  if (p != q) {
    iVar7 = q->m_Expires;
    p->m_ErrCode = q->m_ErrCode;
    p->m_Expires = iVar7;
    iVar7 = UpnpDiscovery_set_DeviceID(p,q->m_DeviceID);
    if (iVar7 == 0) {
      return 0;
    }
    iVar7 = UpnpDiscovery_set_DeviceType(p,q->m_DeviceType);
    if (iVar7 == 0) {
      return 0;
    }
    iVar7 = UpnpDiscovery_set_ServiceType(p,q->m_ServiceType);
    if (iVar7 == 0) {
      return 0;
    }
    iVar7 = UpnpDiscovery_set_ServiceVer(p,q->m_ServiceVer);
    if (iVar7 == 0) {
      return 0;
    }
    iVar7 = UpnpDiscovery_set_Location(p,q->m_Location);
    if (iVar7 == 0) {
      return 0;
    }
    iVar7 = UpnpDiscovery_set_Os(p,q->m_Os);
    if (iVar7 == 0) {
      return 0;
    }
    iVar7 = UpnpDiscovery_set_Date(p,q->m_Date);
    if (iVar7 == 0) {
      return 0;
    }
    iVar7 = UpnpDiscovery_set_Ext(p,q->m_Ext);
    if (iVar7 == 0) {
      return 0;
    }
    psVar9 = &q->m_DestAddr;
    psVar10 = &p->m_DestAddr;
    for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
      cVar1 = psVar9->__ss_padding[0];
      cVar2 = psVar9->__ss_padding[1];
      cVar3 = psVar9->__ss_padding[2];
      cVar4 = psVar9->__ss_padding[3];
      cVar5 = psVar9->__ss_padding[4];
      cVar6 = psVar9->__ss_padding[5];
      psVar10->ss_family = psVar9->ss_family;
      psVar10->__ss_padding[0] = cVar1;
      psVar10->__ss_padding[1] = cVar2;
      psVar10->__ss_padding[2] = cVar3;
      psVar10->__ss_padding[3] = cVar4;
      psVar10->__ss_padding[4] = cVar5;
      psVar10->__ss_padding[5] = cVar6;
      psVar9 = (sockaddr_storage *)((long)psVar9 + (ulong)bVar11 * -0x10 + 8);
      psVar10 = (sockaddr_storage *)((long)psVar10 + (ulong)bVar11 * -0x10 + 8);
    }
  }
  return 1;
}

Assistant:

int UpnpDiscovery_assign(UpnpDiscovery *p, const UpnpDiscovery *q)
{
	int ok = 1;

	if (p != q) {
		ok = ok &&
		     UpnpDiscovery_set_ErrCode(p, UpnpDiscovery_get_ErrCode(q));
		ok = ok &&
		     UpnpDiscovery_set_Expires(p, UpnpDiscovery_get_Expires(q));
		ok = ok && UpnpDiscovery_set_DeviceID(
				   p, UpnpDiscovery_get_DeviceID(q));
		ok = ok && UpnpDiscovery_set_DeviceType(
				   p, UpnpDiscovery_get_DeviceType(q));
		ok = ok && UpnpDiscovery_set_ServiceType(
				   p, UpnpDiscovery_get_ServiceType(q));
		ok = ok && UpnpDiscovery_set_ServiceVer(
				   p, UpnpDiscovery_get_ServiceVer(q));
		ok = ok && UpnpDiscovery_set_Location(
				   p, UpnpDiscovery_get_Location(q));
		ok = ok && UpnpDiscovery_set_Os(p, UpnpDiscovery_get_Os(q));
		ok = ok && UpnpDiscovery_set_Date(p, UpnpDiscovery_get_Date(q));
		ok = ok && UpnpDiscovery_set_Ext(p, UpnpDiscovery_get_Ext(q));
		ok = ok && UpnpDiscovery_set_DestAddr(
				   p, UpnpDiscovery_get_DestAddr(q));
	}

	return ok;
}